

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

void x86SatisfyJumps(FastVector<unsigned_char_*,_false,_false> *instPos)

{
  uchar uVar1;
  int value;
  int iVar2;
  UnsatisfiedJump *pUVar3;
  uchar **ppuVar4;
  uchar *puVar5;
  uchar *puVar6;
  uint index;
  
  index = 0;
  do {
    if (pendingJumps.count <= index) {
      pendingJumps.count = 0;
      return;
    }
    pUVar3 = FastVector<UnsatisfiedJump,_false,_false>::operator[](&pendingJumps,index);
    puVar6 = pUVar3->jmpPos;
    uVar1 = *puVar6;
    if (pUVar3->isNear == true) {
      ppuVar4 = FastVector<unsigned_char_*,_false,_false>::operator[]
                          (instPos,pUVar3->labelID & 0xffffff);
      puVar5 = *ppuVar4;
      if (uVar1 == '\x0f') {
        puVar6 = pUVar3->jmpPos;
        iVar2 = ((int)puVar5 - (int)puVar6) + -6;
LAB_001c0c99:
        *(int *)(puVar6 + 2) = iVar2;
      }
      else {
        if (uVar1 == 0x8d) goto LAB_001c0c5c;
LAB_001c0c4d:
        *(int *)(pUVar3->jmpPos + 1) = ((int)puVar5 - (int)pUVar3->jmpPos) + -5;
      }
    }
    else {
      ppuVar4 = FastVector<unsigned_char_*,_false,_false>::operator[](&labels,pUVar3->labelID);
      puVar5 = *ppuVar4;
      if (uVar1 == 0x8d) {
LAB_001c0c5c:
        iVar2 = (int)puVar5;
        puVar6 = pUVar3->jmpPos;
        goto LAB_001c0c99;
      }
      if (uVar1 == 0xe8) goto LAB_001c0c4d;
      if (0x7f < (long)puVar6 - (long)puVar5) {
        __assert_fail("uJmp.jmpPos - labels[uJmp.labelID] + 128 < 256",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                      ,0x964,"void x86SatisfyJumps(FastVector<unsigned char *> &)");
      }
      ppuVar4 = FastVector<unsigned_char_*,_false,_false>::operator[](&labels,pUVar3->labelID);
      pUVar3->jmpPos[1] = ((char)*(undefined4 *)ppuVar4 - (char)pUVar3->jmpPos) + 0xfe;
    }
    index = index + 1;
  } while( true );
}

Assistant:

void x86SatisfyJumps(FastVector<unsigned char*>& instPos)
{
	for(unsigned int i = 0; i < pendingJumps.size(); i++)
	{
		UnsatisfiedJump& uJmp = pendingJumps[i];
		if(uJmp.isNear)
		{
			if(*uJmp.jmpPos == 0xe8)
			{
				// This one is for call label
				int value = (int)(instPos[uJmp.labelID & 0x00ffffff] - uJmp.jmpPos-5);
				memcpy(uJmp.jmpPos + 1, &value, sizeof(value));
			}
			else if(*uJmp.jmpPos == 0x8d)
			{
				// This one is for lea reg, [label+offset]
				int value = (int)(intptr_t)(instPos[uJmp.labelID & 0x00ffffff]);
				memcpy(uJmp.jmpPos + 2, &value, sizeof(value));
			}
			else
			{
				if(*uJmp.jmpPos == 0x0f)
				{
					int value = (int)(instPos[uJmp.labelID & 0x00ffffff] - uJmp.jmpPos-6);
					memcpy(uJmp.jmpPos + 2, &value, sizeof(value));
				}
				else
				{
					int value = (int)(instPos[uJmp.labelID & 0x00ffffff] - uJmp.jmpPos-5);
					memcpy(uJmp.jmpPos + 1, &value, sizeof(value));
				}
			}
		}
		else
		{
			if(*uJmp.jmpPos == 0xe8)
			{
				// This one is for call label
				int value = (int)(labels[uJmp.labelID] - uJmp.jmpPos-5);
				memcpy(uJmp.jmpPos + 1, &value, sizeof(value));
			}
			else if(*uJmp.jmpPos == 0x8d)
			{
				// This one is for lea reg, [label+offset]
				int value = (int)(intptr_t)(labels[uJmp.labelID]);
				memcpy(uJmp.jmpPos + 2, &value, sizeof(value));
			}
			else
			{
				assert(uJmp.jmpPos - labels[uJmp.labelID] + 128 < 256);
				*(char*)(uJmp.jmpPos+1) = (char)(labels[uJmp.labelID] - uJmp.jmpPos-2);
			}
		}
	}
	pendingJumps.clear();
}